

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_move_grow.cpp
# Opt level: O0

void move_grow_general_undo_redo
               (Am_Object *command_obj,bool undo,bool selective,bool reload_data,Am_Object *obj,
               Am_Value *new_val)

{
  bool bVar1;
  Am_Value *pAVar2;
  ostream *poVar3;
  Am_Wrapper *pAVar4;
  Am_Inter_Location local_90;
  Am_Object local_88;
  Am_Inter_Location local_80;
  Am_Object local_78;
  Am_Inter_Location local_70;
  Am_Inter_Location new_data;
  Am_Inter_Location old_data;
  Am_Object local_58;
  undefined1 local_49;
  bool beep_on_abort;
  Am_Inter_Location new_loc;
  bool growing;
  Am_Object local_30;
  Am_Object inter;
  Am_Value *new_val_local;
  Am_Object *obj_local;
  bool reload_data_local;
  bool selective_local;
  bool undo_local;
  Am_Object *command_obj_local;
  
  inter.data = (Am_Object_Data *)new_val;
  Am_Object::Am_Object(&local_30);
  pAVar2 = Am_Object::Get(command_obj,0x170,0);
  Am_Object::operator=(&local_30,pAVar2);
  pAVar2 = Am_Object::Get(command_obj,0xda,0);
  new_loc.data._3_1_ = Am_Value::operator_cast_to_bool(pAVar2);
  Am_Inter_Location::Am_Inter_Location((Am_Inter_Location *)&stack0xffffffffffffffb8);
  if ((reload_data) && (bVar1 = Am_Value::Valid(new_val), bVar1)) {
    bVar1 = Am_Inter_Location::Test(new_val);
    if (!bVar1) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"** Amulet_Error: ");
      poVar3 = std::operator<<(poVar3,"New value for selective repeat of ");
      poVar3 = operator<<(poVar3,command_obj);
      poVar3 = std::operator<<(poVar3," is not Am_Inter_Location: ");
      poVar3 = operator<<(poVar3,new_val);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      Am_Error();
    }
    Am_Inter_Location::operator=((Am_Inter_Location *)&stack0xffffffffffffffb8,new_val);
    pAVar2 = Am_Object::Get(&local_30,0xd3,0);
    local_49 = Am_Value::operator_cast_to_bool(pAVar2);
    if ((((new_loc.data._3_1_ & 1) != 0) && ((bool)local_49)) &&
       (bVar1 = Am_Inter_Location::Is_Zero_Size((Am_Inter_Location *)&stack0xffffffffffffffb8),
       bVar1)) {
      Am_Object::Set(command_obj,0x166,true,1);
      Am_Object::Am_Object(&local_58,&Am_No_Object);
      Am_Beep(&local_58);
      Am_Object::~Am_Object(&local_58);
      goto LAB_0023d150;
    }
  }
  if ((reload_data) && (bVar1 = Am_Object::Valid(obj), bVar1)) {
    pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(obj);
    Am_Object::Set(command_obj,0x16d,pAVar4,0);
  }
  else {
    pAVar2 = Am_Object::Get(command_obj,0x16d,0);
    Am_Object::operator=(obj,pAVar2);
  }
  bVar1 = Am_Object::Valid(obj);
  if (bVar1) {
    Am_Inter_Location::Am_Inter_Location(&new_data);
    Am_Inter_Location::Am_Inter_Location(&local_70);
    Am_Object::Make_Unique(command_obj,0x16c);
    Am_Object::Make_Unique(command_obj,0x169);
    pAVar2 = Am_Object::Get(command_obj,0x16c,0);
    Am_Inter_Location::operator=(&new_data,pAVar2);
    if ((reload_data) &&
       (bVar1 = Am_Inter_Location::Valid((Am_Inter_Location *)&stack0xffffffffffffffb8), bVar1)) {
      Am_Inter_Location::operator=(&local_70,(Am_Inter_Location *)&stack0xffffffffffffffb8);
      pAVar4 = Am_Inter_Location::operator_cast_to_Am_Wrapper_(&local_70);
      Am_Object::Set(command_obj,0x169,pAVar4,0);
    }
    else {
      pAVar2 = Am_Object::Get(command_obj,0x169,0);
      Am_Inter_Location::operator=(&local_70,pAVar2);
    }
    if (selective) {
      if (undo) {
        Am_Object::Am_Object(&local_78,obj);
        Am_Inter_Location::Am_Inter_Location(&local_80,&local_70);
        Am_Set_Data_From_Object(&local_78,&local_80,(bool)(new_loc.data._3_1_ & 1));
        Am_Inter_Location::~Am_Inter_Location(&local_80);
        Am_Object::~Am_Object(&local_78);
      }
      else {
        Am_Object::Am_Object(&local_88,obj);
        Am_Inter_Location::Am_Inter_Location(&local_90,&new_data);
        Am_Set_Data_From_Object(&local_88,&local_90,(bool)(new_loc.data._3_1_ & 1));
        Am_Inter_Location::~Am_Inter_Location(&local_90);
        Am_Object::~Am_Object(&local_88);
      }
    }
    if (undo) {
      Am_Check_And_Fix_Owner_For_Object(obj,&new_data);
      Am_Modify_Object_Pos(obj,&new_data,(bool)(new_loc.data._3_1_ & 1));
      Am_Inter_Location::Swap_With(&local_70,&new_data,false);
      Am_Object::Note_Changed(command_obj,0x16c);
      Am_Object::Note_Changed(command_obj,0x169);
    }
    else {
      Am_Check_And_Fix_Owner_For_Object(obj,&local_70);
      Am_Modify_Object_Pos(obj,&local_70,(bool)(new_loc.data._3_1_ & 1));
      if (selective) {
        Am_Object::Note_Changed(command_obj,0x16c);
        Am_Object::Note_Changed(command_obj,0x169);
      }
    }
    Am_Inter_Location::~Am_Inter_Location(&local_70);
    Am_Inter_Location::~Am_Inter_Location(&new_data);
  }
LAB_0023d150:
  Am_Inter_Location::~Am_Inter_Location((Am_Inter_Location *)&stack0xffffffffffffffb8);
  Am_Object::~Am_Object(&local_30);
  return;
}

Assistant:

void
move_grow_general_undo_redo(Am_Object command_obj, bool undo, bool selective,
                            bool reload_data, Am_Object obj = Am_No_Object,
                            Am_Value new_val = Am_No_Value)
{
  Am_Object inter;
  inter = command_obj.Get(Am_SAVED_OLD_OWNER);
  bool growing = command_obj.Get(Am_GROWING);
  Am_Inter_Location new_loc;

  if (reload_data && new_val.Valid()) {
    if (!Am_Inter_Location::Test(new_val))
      Am_ERRORO("New value for selective repeat of "
                    << command_obj << " is not Am_Inter_Location: " << new_val,
                command_obj, Am_VALUE);
    new_loc = new_val;
    bool beep_on_abort = inter.Get(Am_INTER_BEEP_ON_ABORT);
    if (growing && beep_on_abort && new_loc.Is_Zero_Size()) {
      Am_INTER_TRACE_PRINT(inter, "Aborting " << command_obj
                                              << " because zero size");
      //not queued for undo
      command_obj.Set(Am_COMMAND_IS_ABORTING, true, Am_OK_IF_NOT_THERE);
      Am_Beep();
      return;
    }
  }

  if (reload_data && obj.Valid())
    command_obj.Set(Am_OBJECT_MODIFIED, obj);
  else
    obj = command_obj.Get(Am_OBJECT_MODIFIED);

#ifdef DEBUG
  if (inter.Valid() && Am_Inter_Tracing(inter)) {
    if (selective)
      std::cout << "Selective ";
    if (undo)
      std::cout << "Undo";
    else
      std::cout << "Redo";
    std::cout << " command " << command_obj << " on obj " << obj << std::endl
              << std::flush;
  }
#endif
  if (obj.Valid()) {
    Am_Inter_Location old_data, new_data;
    command_obj.Make_Unique(Am_OLD_VALUE); //will be destructively modifying
    command_obj.Make_Unique(Am_VALUE);     //these slots; make sure
                                           //not shared
    old_data = command_obj.Get(Am_OLD_VALUE);
    if (reload_data && new_loc.Valid()) {
      new_data = new_loc;
      command_obj.Set(Am_VALUE, new_data);
    } else
      new_data = command_obj.Get(Am_VALUE);

    if (selective) {
      if (undo)
        Am_Set_Data_From_Object(obj, new_data, growing);
      else
        Am_Set_Data_From_Object(obj, old_data, growing);
    }
    if (undo) {
      Am_Check_And_Fix_Owner_For_Object(obj, old_data);
#ifdef DEBUG
      if (growing != old_data.Get_Growing())
        Am_ERRORO("Growing in cmd " << command_obj << " != old_data growing "
                                    << old_data,
                  command_obj, Am_GROWING);
#endif
      Am_Modify_Object_Pos(obj, old_data, growing);
      // swap current and old values, in case undo or undo-the-undo again
      new_data.Swap_With(old_data, false);
      command_obj.Note_Changed(Am_OLD_VALUE);
      command_obj.Note_Changed(Am_VALUE);
    } else {
      Am_Check_And_Fix_Owner_For_Object(obj, new_data);
#ifdef DEBUG
      if (growing != new_data.Get_Growing())
        Am_ERRORO("Growing in cmd " << command_obj << " != new_data growing "
                                    << new_data,
                  command_obj, Am_GROWING);
#endif
      Am_Modify_Object_Pos(obj, new_data, growing);
      if (selective) {
        command_obj.Note_Changed(Am_OLD_VALUE);
        command_obj.Note_Changed(Am_VALUE);
      }
    }
  }
}